

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

void mxx::
     distribute<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,comm *comm)

{
  ulong total_size;
  void *pvVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __dest;
  long *plVar2;
  pointer puVar3;
  long lVar4;
  size_t __n;
  int rank_1;
  size_t local_size;
  int result;
  signed_size_t surplus;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  custom_op<unsigned_long> op;
  uint local_c4;
  ulong local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  long local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  size_t local_78;
  custom_op<unsigned_long> local_70;
  
  if (comm->m_size == 1) {
    if ((long)end._M_current - (long)begin._M_current == 0) {
      return;
    }
    memmove(out._M_current,begin._M_current,(long)end._M_current - (long)begin._M_current);
    return;
  }
  local_78 = (long)end._M_current - (long)begin._M_current;
  local_c0 = (long)local_78 >> 2;
  local_98._M_current = out._M_current;
  custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&local_70,1);
  MPI_Allreduce(&local_c0,&local_b8,1,local_70.m_type_copy,local_70.m_op,comm->mpi_comm);
  total_size = CONCAT44(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (uint)local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  custom_op<unsigned_long>::~custom_op(&local_70);
  local_70._vptr_custom_op._0_4_ = (uint)(local_c0 == total_size);
  MPI_Allreduce(&local_70,&local_b8,1,&ompi_mpi_int,&ompi_mpi_op_lor,comm->mpi_comm);
  if ((uint)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    impl::
    distribute_scatter<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (begin,end,local_98,total_size,comm);
    return;
  }
  local_a0 = (-(total_size / (uint)comm->m_size) -
             (ulong)((ulong)(uint)comm->m_rank < total_size % (ulong)(uint)comm->m_size)) + local_c0
  ;
  allgather<long>((vector<long,_std::allocator<long>_> *)&local_70,&local_a0,1,comm);
  __dest._M_current = local_98._M_current;
  plVar2 = (long *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op);
  if (plVar2 != (long *)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_) {
    lVar4 = 0;
    do {
      lVar4 = lVar4 + *plVar2;
      plVar2 = plVar2 + 1;
    } while (plVar2 != (long *)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_)
    ;
    if (lVar4 != 0) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&local_b8);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
             (ulong)(uint)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
             "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
             ,0xe9,"distribute",
             "std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0"
            );
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    }
  }
  impl::surplus_send_pairing
            (&local_b8,(vector<long,_std::allocator<long>_> *)&local_70,comm->m_size,comm->m_rank,
             false);
  all2all<unsigned_long>(&local_90,&local_b8,comm);
  if (local_a0 < 1) {
    puVar3 = (pointer)CONCAT44(local_b8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                               (uint)local_b8.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    if (puVar3 != local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish) {
      lVar4 = 0;
      do {
        lVar4 = lVar4 + *puVar3;
        puVar3 = puVar3 + 1;
      } while (puVar3 != local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      if (lVar4 != 0) {
        MPI_Comm_rank(&ompi_mpi_comm_world,&local_c4);
        printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_c4,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
               ,0xf5,"distribute",
               "std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0"
              );
        fflush(_stdout);
        MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
      }
    }
    all2allv<int>((int *)0x0,&local_b8,__dest._M_current + local_c0,&local_90,comm);
    __n = local_78;
    if (end._M_current == begin._M_current) goto LAB_0013cadd;
  }
  else {
    if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar4 = 0;
      puVar3 = local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar4 = lVar4 + *puVar3;
        puVar3 = puVar3 + 1;
      } while (puVar3 != local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      if (lVar4 != 0) {
        MPI_Comm_rank(&ompi_mpi_comm_world,&local_c4);
        printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_c4,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
               ,0xf0,"distribute",
               "std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0"
              );
        fflush(_stdout);
        MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
      }
    }
    all2allv<int>(begin._M_current + (local_c0 - local_a0),&local_b8,(int *)0x0,&local_90,comm);
    if (local_c0 - local_a0 == 0) goto LAB_0013cadd;
    __n = (local_c0 - local_a0) * 4;
  }
  memmove(__dest._M_current,begin._M_current,__n);
LAB_0013cadd:
  if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar1 = (void *)CONCAT44(local_b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_b8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_b8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  pvVar1 = (void *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_70.m_user_func.super__Function_base._M_functor._8_8_ - (long)pvVar1
                   );
  }
  return;
}

Assistant:

void distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if single process, copy input to output
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get sizes
    size_t local_size = std::distance(begin, end);
    size_t total_size = mxx::allreduce(local_size, comm);
    typedef typename std::iterator_traits<_InIterator>::value_type T;

    if (mxx::any_of(local_size == total_size, comm)) {
        // use scatterv instead of all2all based communication
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // use surplus send-pairing to minimize total communication volume
        // TODO: use all2all or send/recv depending on the maximum number of
        //       paired processes

        // get surplus
        blk_dist part(total_size, comm.size(), comm.rank());
        impl::signed_size_t surplus = (impl::signed_size_t)local_size - (impl::signed_size_t)part.local_size();

        // allgather surpluses
        // TODO figure out how to do surplus send pairing without requiring allgather
        std::vector<impl::signed_size_t> surpluses = mxx::allgather(surplus, comm);
        MXX_ASSERT(std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0);

        // get send counts
        std::vector<size_t> send_counts = impl::surplus_send_pairing(surpluses, comm.size(), comm.rank(), false);
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);

        if (surplus > 0) {
            MXX_ASSERT(std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0);
            // TODO: use iterators not pointers
            mxx::all2allv(&(*(begin+((impl::signed_size_t)local_size-surplus))), send_counts, (T*)nullptr, recv_counts, comm);
            std::copy(begin, begin+(local_size-surplus), out);
        } else {
            MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0);
            mxx::all2allv((const T*)nullptr, send_counts, &(*(out+local_size)), recv_counts, comm);
            std::copy(begin, end, out);
        }
    }
}